

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

void xmlParseXMLCatalogNodeList
               (xmlNodePtr cur,xmlCatalogPrefer prefer,xmlCatalogEntryPtr parent,
               xmlCatalogEntryPtr cgroup)

{
  int iVar1;
  xmlCatalogEntryPtr cgroup_local;
  xmlCatalogEntryPtr parent_local;
  _xmlNode *p_Stack_10;
  xmlCatalogPrefer prefer_local;
  xmlNodePtr cur_local;
  
  for (p_Stack_10 = cur; p_Stack_10 != (xmlNodePtr)0x0; p_Stack_10 = p_Stack_10->next) {
    if ((p_Stack_10->ns != (xmlNs *)0x0) && (p_Stack_10->ns->href != (xmlChar *)0x0)) {
      iVar1 = xmlStrEqual(p_Stack_10->ns->href,
                          (xmlChar *)"urn:oasis:names:tc:entity:xmlns:xml:catalog");
      if (iVar1 != 0) {
        xmlParseXMLCatalogNode(p_Stack_10,prefer,parent,cgroup);
      }
    }
  }
  return;
}

Assistant:

static void
xmlParseXMLCatalogNodeList(xmlNodePtr cur, xmlCatalogPrefer prefer,
	                   xmlCatalogEntryPtr parent, xmlCatalogEntryPtr cgroup) {
    while (cur != NULL) {
	if ((cur->ns != NULL) && (cur->ns->href != NULL) &&
	    (xmlStrEqual(cur->ns->href, XML_CATALOGS_NAMESPACE))) {
	    xmlParseXMLCatalogNode(cur, prefer, parent, cgroup);
	}
	cur = cur->next;
    }
    /* TODO: sort the list according to REWRITE lengths and prefer value */
}